

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int __thiscall FixedSizeCache<int>::at(FixedSizeCache<int> *this,int index)

{
  const_reference pvVar1;
  runtime_error *this_00;
  
  if (index < this->_count) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(&this->_data,(long)index);
    return *pvVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache index out-of-range");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T
    at(int const index) const
    {
        if (index >= this->_count) throw std::runtime_error("FixedSizeCache index out-of-range");
        return this->_data.at(index);
    }